

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O3

void __thiscall vec<Branching*>::vec<Branching*>(vec<Branching*> *this,vec<Branching_*> *other)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = other->sz;
  uVar4 = (ulong)uVar1;
  *(uint *)this = uVar1;
  *(uint *)(this + 4) = uVar1;
  pvVar2 = malloc(uVar4 * 8);
  *(void **)(this + 8) = pvVar2;
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      *(Branching **)(*(long *)(this + 8) + uVar3 * 8) = other->data[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  return;
}

Assistant:

vec(vec<U>& other) : sz(other.size()), cap(sz) {
		assert(sizeof(U) == sizeof(T));
		data = (T*)malloc(cap * sizeof(T));
		for (unsigned int i = 0; i < sz; i++) {
			new (&data[i]) T(other[i]);
		}
		//		for (int i = 0; i < sz; i++) data[i] = other[i];
	}